

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O3

void __thiscall PageStack<FinalizableObject_*>::Abort(PageStack<FinalizableObject_*> *this)

{
  Chunk *page;
  PagePool *this_00;
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Chunk *pCVar4;
  undefined8 *in_FS_OFFSET;
  
  page = this->currentChunk;
  if (page == (Chunk *)0x0) {
    if (this->count != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x16e,"(count == 0)","count == 0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
  }
  else {
    for (pCVar4 = page->nextChunk; pCVar4 != (Chunk *)0x0; pCVar4 = pCVar4->nextChunk) {
      this->currentChunk = pCVar4;
      this->pageCount = this->pageCount - 1;
      this_00 = this->pagePool;
      if ((page->super_PagePoolPage).isReserved == true) {
        Memory::PagePool::FreeReservedPage(this_00,&page->super_PagePoolPage);
        pCVar4 = this->currentChunk;
      }
      else {
        page->nextChunk = (Chunk *)this_00->freePageList;
        this_00->freePageList = (PagePoolFreePage *)page;
      }
      page = pCVar4;
    }
    this->chunkStart = (FinalizableObject **)(page + 1);
    this->chunkEnd = (FinalizableObject **)(page + 0x80);
    this->nextEntry = (FinalizableObject **)(page + 1);
    this->count = 0;
  }
  return;
}

Assistant:

void PageStack<T>::Abort()
{
    // Abandon the current entries in the stack and reset to initialized state.

    if (currentChunk == nullptr)
    {
        Assert(count == 0);
        return;
    }

    // Free all the chunks except the first one
    while (currentChunk->nextChunk != nullptr)
    {
        Chunk * temp = currentChunk;
        currentChunk = currentChunk->nextChunk;
        FreeChunk(temp);
    }

    chunkStart = currentChunk->entries;
    chunkEnd = &currentChunk->entries[EntriesPerChunk];
    nextEntry = chunkStart;

#if DBG
    count = 0;
#endif
}